

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_text(format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *this,char *begin,char *end)

{
  buffer_appender<char> __result;
  buffer<char> *buf;
  long lVar1;
  
  lVar1 = (long)end - (long)begin;
  if (-1 < lVar1) {
    __result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    if (*(ulong *)((long)__result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container + 0x18) <
        (ulong)(*(long *)((long)__result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + lVar1)) {
      (*(code *)**(undefined8 **)
                  __result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (__result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    if (end != begin) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>(begin,begin + lVar1,__result);
    }
    (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)
         __result.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

constexpr int num_bits() {
  return std::numeric_limits<T>::digits;
}